

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

plugin_loader_conflict plugin_loader_create(plugin_manager manager)

{
  int iVar1;
  char *name;
  plugin_manager in_RDI;
  size_t name_length;
  plugin_loader_conflict l;
  size_t in_stack_ffffffffffffffd8;
  plugin_loader_conflict in_stack_fffffffffffffff8;
  plugin_loader_conflict l_00;
  
  if (in_RDI == (plugin_manager)0x0) {
    log_write_impl_va("metacall",0x7c,"plugin_loader_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                      ,LOG_LEVEL_ERROR,"Invalid plugin loader manager");
    l_00 = (plugin_loader_conflict)0x0;
  }
  else {
    l_00 = (plugin_loader_conflict)malloc(0x18);
    if (l_00 == (plugin_loader_conflict)0x0) {
      log_write_impl_va("metacall",0x84,"plugin_loader_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                        ,LOG_LEVEL_ERROR,"Invalid plugin loader allocation");
      l_00 = (plugin_loader_conflict)0x0;
    }
    else {
      l_00->manager = in_RDI;
      l_00->library_suffix = (char *)0x0;
      l_00->symbol_iface_suffix = (char *)0x0;
      name = (char *)strlen(in_RDI->name);
      iVar1 = plugin_loader_library_suffix(l_00,name,in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        iVar1 = plugin_loader_symbol_iface_suffix
                          (in_stack_fffffffffffffff8,(char *)in_RDI,(size_t)l_00);
        if (iVar1 != 0) {
          plugin_loader_destroy((plugin_loader_conflict)0x1208e0);
          l_00 = (plugin_loader_conflict)0x0;
        }
      }
      else {
        plugin_loader_destroy((plugin_loader_conflict)0x1208af);
        l_00 = (plugin_loader_conflict)0x0;
      }
    }
  }
  return l_00;
}

Assistant:

plugin_loader plugin_loader_create(plugin_manager manager)
{
	if (manager == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader manager");
		return NULL;
	}

	plugin_loader l = malloc(sizeof(struct plugin_loader_type));

	if (l == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader allocation");
		return NULL;
	}

	l->manager = manager;
	l->library_suffix = NULL;
	l->symbol_iface_suffix = NULL;

	/* Generate the suffixes */
	size_t name_length = strlen(manager->name);

	if (plugin_loader_library_suffix(l, manager->name, name_length) != 0)
	{
		plugin_loader_destroy(l);
		return NULL;
	}

	if (plugin_loader_symbol_iface_suffix(l, manager->name, name_length) != 0)
	{
		plugin_loader_destroy(l);
		return NULL;
	}

	return l;
}